

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfa.h
# Opt level: O2

vector<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
* spvtools::CFA<spvtools::val::BasicBlock>::CalculateDominators
            (vector<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
             *__return_storage_ptr__,
            vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
            *postorder,get_blocks_func *predecessor_func)

{
  key_type *ppBVar1;
  vector<std::pair<spvtools::val::BasicBlock*,spvtools::val::BasicBlock*>,std::allocator<std::pair<spvtools::val::BasicBlock*,spvtools::val::BasicBlock*>>>
  *this;
  bool bVar2;
  pointer ppBVar3;
  mapped_type *pmVar4;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *pvVar5;
  __normal_iterator<spvtools::val::BasicBlock_*const_*,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
  _Var6;
  size_type sVar7;
  _Hash_node_base *p_Var8;
  _Hash_node_base *p_Var9;
  __normal_iterator<const_spvtools::val::BasicBlock_*const_*,_std::vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>_>
  __tmp;
  key_type *__k;
  size_t sVar10;
  pointer ppBVar11;
  size_t i;
  ulong uVar12;
  size_t sVar13;
  long lVar14;
  pointer ppBVar15;
  __node_base _Var16;
  BasicBlock *idom;
  BasicBlock *p;
  unordered_map<const_spvtools::val::BasicBlock_*,_block_detail,_std::hash<const_spvtools::val::BasicBlock_*>,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>_>_>
  idoms;
  pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*> local_90;
  BasicBlock *local_80;
  vector<std::pair<spvtools::val::BasicBlock*,spvtools::val::BasicBlock*>,std::allocator<std::pair<spvtools::val::BasicBlock*,spvtools::val::BasicBlock*>>>
  *local_78;
  pointer local_70;
  _Hashtable<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  ppBVar11 = (postorder->
             super__Vector_base<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  ppBVar3 = (postorder->
            super__Vector_base<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  p_Var9 = (_Hash_node_base *)((long)ppBVar3 - (long)ppBVar11 >> 3);
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  lVar14 = 0;
  for (uVar12 = 0; uVar12 < (ulong)((long)ppBVar3 - (long)ppBVar11 >> 3); uVar12 = uVar12 + 1) {
    pmVar4 = std::__detail::
             _Map_base<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&local_68,(key_type *)((long)ppBVar11 + lVar14));
    pmVar4->dominator = (size_t)p_Var9;
    pmVar4->postorder_index = uVar12;
    ppBVar11 = (postorder->
               super__Vector_base<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
    ppBVar3 = (postorder->
              super__Vector_base<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    lVar14 = lVar14 + 8;
  }
  local_78 = (vector<std::pair<spvtools::val::BasicBlock*,spvtools::val::BasicBlock*>,std::allocator<std::pair<spvtools::val::BasicBlock*,spvtools::val::BasicBlock*>>>
              *)__return_storage_ptr__;
  pmVar4 = std::__detail::
           _Map_base<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&local_68,ppBVar3 + -1);
  sVar13 = pmVar4->postorder_index;
  pmVar4 = std::__detail::
           _Map_base<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&local_68,
                        (postorder->
                        super__Vector_base<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
                        )._M_impl.super__Vector_impl_data._M_finish + -1);
  pmVar4->dominator = sVar13;
  do {
    __k = (postorder->
          super__Vector_base<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
          )._M_impl.super__Vector_impl_data._M_finish + -1;
    bVar2 = false;
    while (this = local_78,
          __k != (postorder->
                 super__Vector_base<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
                 )._M_impl.super__Vector_impl_data._M_start) {
      ppBVar1 = __k + -1;
      __k = __k + -1;
      pvVar5 = std::
               function<const_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_*(const_spvtools::val::BasicBlock_*)>
               ::operator()(predecessor_func,*ppBVar1);
      _Var6 = std::
              __find_if<__gnu_cxx::__normal_iterator<spvtools::val::BasicBlock*const*,std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>>,__gnu_cxx::__ops::_Iter_pred<spvtools::CFA<spvtools::val::BasicBlock>::CalculateDominators(std::vector<spvtools::val::BasicBlock_const*,std::allocator<spvtools::val::BasicBlock_const*>>const&,std::function<std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>const*(spvtools::val::BasicBlock_const*)>)::_lambda(spvtools::val::BasicBlock*)_1_>>
                        ((pvVar5->
                         super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                         )._M_impl.super__Vector_impl_data._M_start,
                         (pvVar5->
                         super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                         )._M_impl.super__Vector_impl_data._M_finish,&local_68,p_Var9);
      if (_Var6._M_current !=
          (pvVar5->
          super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        local_90.first = *_Var6._M_current;
        pmVar4 = std::__detail::
                 _Map_base<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&local_68,&local_90.first);
        local_70 = (pvVar5->
                   super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        sVar13 = pmVar4->postorder_index;
        for (ppBVar15 = (pvVar5->
                        super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                        )._M_impl.super__Vector_impl_data._M_start; ppBVar15 != local_70;
            ppBVar15 = ppBVar15 + 1) {
          local_80 = *ppBVar15;
          sVar10 = sVar13;
          if (((local_90.first != local_80) &&
              (sVar7 = std::
                       _Hashtable<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::count(&local_68,&local_80), sVar7 != 0)) &&
             (pmVar4 = std::__detail::
                       _Map_base<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)&local_68,&local_80),
             (_Hash_node_base *)pmVar4->dominator != p_Var9)) {
            pmVar4 = std::__detail::
                     _Map_base<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)&local_68,&local_80);
            sVar10 = pmVar4->postorder_index;
            while (sVar10 != sVar13) {
              while (sVar10 < sVar13) {
                pmVar4 = std::__detail::
                         _Map_base<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         ::operator[]((_Map_base<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                       *)&local_68,
                                      (postorder->
                                      super__Vector_base<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
                                      )._M_impl.super__Vector_impl_data._M_start + sVar10);
                sVar10 = pmVar4->dominator;
              }
              while (sVar13 < sVar10) {
                pmVar4 = std::__detail::
                         _Map_base<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         ::operator[]((_Map_base<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                       *)&local_68,
                                      (postorder->
                                      super__Vector_base<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
                                      )._M_impl.super__Vector_impl_data._M_start + sVar13);
                sVar13 = pmVar4->dominator;
              }
            }
          }
          sVar13 = sVar10;
        }
        pmVar4 = std::__detail::
                 _Map_base<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&local_68,__k);
        if (pmVar4->dominator != sVar13) {
          pmVar4 = std::__detail::
                   _Map_base<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&local_68,__k);
          pmVar4->dominator = sVar13;
          bVar2 = true;
        }
      }
    }
  } while (bVar2);
  *(undefined8 *)(local_78 + 0x10) = 0;
  *(undefined8 *)local_78 = 0;
  *(undefined8 *)(local_78 + 8) = 0;
  for (_Var16._M_nxt = local_68._M_before_begin._M_nxt; _Var16._M_nxt != (_Hash_node_base *)0x0;
      _Var16._M_nxt = (_Var16._M_nxt)->_M_nxt) {
    p_Var8 = _Var16._M_nxt[2]._M_nxt;
    if (p_Var8 == p_Var9) {
      p_Var8 = _Var16._M_nxt[3]._M_nxt;
    }
    local_90.first = (BasicBlock *)_Var16._M_nxt[1]._M_nxt;
    local_90.second =
         (postorder->
         super__Vector_base<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
         )._M_impl.super__Vector_impl_data._M_start[(long)p_Var8];
    std::
    vector<std::pair<spvtools::val::BasicBlock*,spvtools::val::BasicBlock*>,std::allocator<std::pair<spvtools::val::BasicBlock*,spvtools::val::BasicBlock*>>>
    ::emplace_back<std::pair<spvtools::val::BasicBlock*,spvtools::val::BasicBlock*>>(this,&local_90)
    ;
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<std::pair<spvtools::val::BasicBlock*,spvtools::val::BasicBlock*>*,std::vector<std::pair<spvtools::val::BasicBlock*,spvtools::val::BasicBlock*>,std::allocator<std::pair<spvtools::val::BasicBlock*,spvtools::val::BasicBlock*>>>>,__gnu_cxx::__ops::_Iter_comp_iter<spvtools::CFA<spvtools::val::BasicBlock>::CalculateDominators(std::vector<spvtools::val::BasicBlock_const*,std::allocator<spvtools::val::BasicBlock_const*>>const&,std::function<std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>const*(spvtools::val::BasicBlock_const*)>)::_lambda(std::pair<spvtools::val::BasicBlock*,spvtools::val::BasicBlock*>const&,std::pair<spvtools::val::BasicBlock*,spvtools::val::BasicBlock*>const&)_1_>>
            (*(pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*> **)this,
             *(pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*> **)(this + 8),
             (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ValveSoftware[P]Fossilize_cli_SPIRV_Tools_source_cfa_h:293:7)>
              )&local_68);
  std::
  _Hashtable<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  return (vector<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
          *)this;
}

Assistant:

std::vector<std::pair<BB*, BB*>> CFA<BB>::CalculateDominators(
    const std::vector<cbb_ptr>& postorder, get_blocks_func predecessor_func) {
  struct block_detail {
    size_t dominator;  ///< The index of blocks's dominator in post order array
    size_t postorder_index;  ///< The index of the block in the post order array
  };
  const size_t undefined_dom = postorder.size();

  std::unordered_map<cbb_ptr, block_detail> idoms;
  for (size_t i = 0; i < postorder.size(); i++) {
    idoms[postorder[i]] = {undefined_dom, i};
  }
  idoms[postorder.back()].dominator = idoms[postorder.back()].postorder_index;

  bool changed = true;
  while (changed) {
    changed = false;
    for (auto b = postorder.rbegin() + 1; b != postorder.rend(); ++b) {
      const std::vector<BB*>& predecessors = *predecessor_func(*b);
      // Find the first processed/reachable predecessor that is reachable
      // in the forward traversal.
      auto res = std::find_if(std::begin(predecessors), std::end(predecessors),
                              [&idoms, undefined_dom](BB* pred) {
                                return idoms.count(pred) &&
                                       idoms[pred].dominator != undefined_dom;
                              });
      if (res == end(predecessors)) continue;
      const BB* idom = *res;
      size_t idom_idx = idoms[idom].postorder_index;

      // all other predecessors
      for (const auto* p : predecessors) {
        if (idom == p) continue;
        // Only consider nodes reachable in the forward traversal.
        // Otherwise the intersection doesn't make sense and will never
        // terminate.
        if (!idoms.count(p)) continue;
        if (idoms[p].dominator != undefined_dom) {
          size_t finger1 = idoms[p].postorder_index;
          size_t finger2 = idom_idx;
          while (finger1 != finger2) {
            while (finger1 < finger2) {
              finger1 = idoms[postorder[finger1]].dominator;
            }
            while (finger2 < finger1) {
              finger2 = idoms[postorder[finger2]].dominator;
            }
          }
          idom_idx = finger1;
        }
      }
      if (idoms[*b].dominator != idom_idx) {
        idoms[*b].dominator = idom_idx;
        changed = true;
      }
    }
  }

  std::vector<std::pair<bb_ptr, bb_ptr>> out;
  for (auto idom : idoms) {
    // At this point if there is no dominator for the node, just make it
    // reflexive.
    auto dominator = std::get<1>(idom).dominator;
    if (dominator == undefined_dom) {
      dominator = std::get<1>(idom).postorder_index;
    }
    // NOTE: performing a const cast for convenient usage with
    // UpdateImmediateDominators
    out.push_back({const_cast<BB*>(std::get<0>(idom)),
                   const_cast<BB*>(postorder[dominator])});
  }

  // Sort by postorder index to generate a deterministic ordering of edges.
  std::sort(
      out.begin(), out.end(),
      [&idoms](const std::pair<bb_ptr, bb_ptr>& lhs,
               const std::pair<bb_ptr, bb_ptr>& rhs) {
        assert(lhs.first);
        assert(lhs.second);
        assert(rhs.first);
        assert(rhs.second);
        auto lhs_indices = std::make_pair(idoms[lhs.first].postorder_index,
                                          idoms[lhs.second].postorder_index);
        auto rhs_indices = std::make_pair(idoms[rhs.first].postorder_index,
                                          idoms[rhs.second].postorder_index);
        return lhs_indices < rhs_indices;
      });
  return out;
}